

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleftForest(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *eps,
                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *vec,int *nonz,int n)

{
  long lVar1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  uint *puVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  cpp_dec_float<50U,_int,_void> *pcVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  int *piVar13;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_1b8;
  int local_174;
  long local_170;
  cpp_dec_float<50U,_int,_void> local_168;
  cpp_dec_float<50U,_int,_void> local_128;
  int *local_f0;
  pointer local_e8;
  int *local_e0;
  int *local_d8;
  int *local_d0;
  long local_c8;
  long local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  cpp_dec_float<50U,_int,_void> *local_b0;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_168.fpclass = cpp_dec_float_finite;
  local_168.prec_elem = 10;
  local_168.data._M_elems[0] = 0;
  local_168.data._M_elems[1] = 0;
  local_168.data._M_elems[2] = 0;
  local_168.data._M_elems[3] = 0;
  local_168.data._M_elems[4] = 0;
  local_168.data._M_elems[5] = 0;
  local_168.data._M_elems._24_5_ = 0;
  local_168.data._M_elems[7]._1_3_ = 0;
  local_168.data._M_elems[8] = 0;
  local_168.data._M_elems[9] = 0;
  local_168.exp = 0;
  local_168.neg = false;
  iVar6 = (this->l).firstUpdate;
  local_c8 = (long)iVar6;
  iVar8 = (this->l).firstUnused;
  local_174 = n;
  if (iVar6 < iVar8) {
    local_e8 = (this->l).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_f0 = (this->l).idx;
    local_d0 = (this->l).row;
    local_d8 = (this->l).start;
    lVar9 = (long)iVar8;
    local_e0 = nonz;
    local_b8 = eps;
    do {
      lVar1 = lVar9 + -1;
      iVar6 = local_d0[lVar9 + -1];
      local_128.data._M_elems._32_8_ = *(undefined8 *)(vec[iVar6].m_backend.data._M_elems + 8);
      local_128.data._M_elems._0_16_ = *(undefined1 (*) [16])vec[iVar6].m_backend.data._M_elems;
      puVar3 = vec[iVar6].m_backend.data._M_elems + 4;
      local_128.data._M_elems._16_8_ = *(undefined8 *)puVar3;
      uVar4 = *(undefined8 *)(puVar3 + 2);
      local_128.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_128.exp = vec[iVar6].m_backend.exp;
      local_128.neg = vec[iVar6].m_backend.neg;
      local_128.fpclass = vec[iVar6].m_backend.fpclass;
      local_128.prec_elem = vec[iVar6].m_backend.prec_elem;
      local_c0 = lVar1;
      if (local_128.fpclass == cpp_dec_float_NaN) {
LAB_002b631c:
        lVar10 = (long)local_d8[lVar1];
        iVar6 = local_d8[lVar9];
        if (local_d8[lVar1] < iVar6) {
          piVar13 = local_f0 + lVar10;
          pcVar12 = &local_e8[lVar10].m_backend;
          local_170 = lVar10;
          do {
            iVar8 = *piVar13;
            pnVar2 = vec + iVar8;
            local_168.data._M_elems._32_8_ = *(undefined8 *)(vec[iVar8].m_backend.data._M_elems + 8)
            ;
            local_168.data._M_elems._0_8_ = *(undefined8 *)vec[iVar8].m_backend.data._M_elems;
            local_168.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar8].m_backend.data._M_elems + 2);
            puVar3 = vec[iVar8].m_backend.data._M_elems + 4;
            local_168.data._M_elems._16_8_ = *(undefined8 *)puVar3;
            uVar4 = *(undefined8 *)(puVar3 + 2);
            local_168.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_168.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_168.exp = vec[iVar8].m_backend.exp;
            local_168.neg = vec[iVar8].m_backend.neg;
            local_168.fpclass = vec[iVar8].m_backend.fpclass;
            local_168.prec_elem = vec[iVar8].m_backend.prec_elem;
            if (local_168.fpclass == cpp_dec_float_NaN) {
LAB_002b63f0:
              local_1b8.fpclass = cpp_dec_float_finite;
              local_1b8.prec_elem = 10;
              local_1b8.data._M_elems._0_16_ = ZEXT816(0);
              local_1b8.data._M_elems[4] = 0;
              local_1b8.data._M_elems[5] = 0;
              local_1b8.data._M_elems._24_5_ = 0;
              local_1b8.data._M_elems[7]._1_3_ = 0;
              local_1b8.data._M_elems._32_5_ = 0;
              local_1b8.data._M_elems[9]._1_3_ = 0;
              local_1b8.exp = 0;
              local_1b8.neg = false;
              pcVar11 = &local_128;
              if (pcVar12 != &local_1b8) {
                local_1b8.data._M_elems._32_5_ = local_128.data._M_elems._32_5_;
                local_1b8.data._M_elems[9]._1_3_ = local_128.data._M_elems[9]._1_3_;
                local_1b8.data._M_elems[4] = local_128.data._M_elems[4];
                local_1b8.data._M_elems[5] = local_128.data._M_elems[5];
                local_1b8.data._M_elems._24_5_ = local_128.data._M_elems._24_5_;
                local_1b8.data._M_elems[7]._1_3_ = local_128.data._M_elems[7]._1_3_;
                local_1b8.data._M_elems[0] = local_128.data._M_elems[0];
                local_1b8.data._M_elems[1] = local_128.data._M_elems[1];
                local_1b8.data._M_elems[2] = local_128.data._M_elems[2];
                local_1b8.data._M_elems[3] = local_128.data._M_elems[3];
                local_1b8.exp = local_128.exp;
                local_1b8.neg = local_128.neg;
                local_1b8.fpclass = local_128.fpclass;
                local_1b8.prec_elem = local_128.prec_elem;
                pcVar11 = pcVar12;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_1b8,pcVar11);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_168,&local_1b8);
              if (local_168.fpclass == cpp_dec_float_NaN) {
LAB_002b64ac:
                local_1b8.data._M_elems._32_5_ = local_168.data._M_elems._32_5_;
                local_1b8.data._M_elems[9]._1_3_ = local_168.data._M_elems[9]._1_3_;
                local_1b8.data._M_elems[4] = local_168.data._M_elems[4];
                local_1b8.data._M_elems[5] = local_168.data._M_elems[5];
                local_1b8.data._M_elems._24_5_ = local_168.data._M_elems._24_5_;
                local_1b8.data._M_elems[7]._1_3_ = local_168.data._M_elems[7]._1_3_;
                local_1b8.data._M_elems[2] = local_168.data._M_elems[2];
                local_1b8.data._M_elems[3] = local_168.data._M_elems[3];
                local_1b8.data._M_elems[0] = local_168.data._M_elems[0];
                local_1b8.data._M_elems[1] = local_168.data._M_elems[1];
                local_1b8.exp = local_168.exp;
                local_1b8.neg = local_168.neg;
                local_1b8.fpclass = local_168.fpclass;
                local_1b8.prec_elem = local_168.prec_elem;
              }
              else {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_1b8,0,(type *)0x0);
                iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_168,&local_1b8);
                if (iVar8 != 0) goto LAB_002b64ac;
                local_1b8.fpclass = cpp_dec_float_finite;
                local_1b8.prec_elem = 10;
                local_1b8.data._M_elems._0_16_ = ZEXT816(0);
                local_1b8.data._M_elems[4] = 0;
                local_1b8.data._M_elems[5] = 0;
                local_1b8.data._M_elems._24_5_ = 0;
                local_1b8.data._M_elems[7]._1_3_ = 0;
                local_1b8.data._M_elems._32_5_ = 0;
                local_1b8.data._M_elems[9]._1_3_ = 0;
                local_1b8.exp = 0;
                local_1b8.neg = false;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&local_1b8,1e-100);
              }
              *(ulong *)((pnVar2->m_backend).data._M_elems + 8) =
                   CONCAT35(local_1b8.data._M_elems[9]._1_3_,local_1b8.data._M_elems._32_5_);
              *(undefined8 *)((pnVar2->m_backend).data._M_elems + 4) =
                   local_1b8.data._M_elems._16_8_;
              *(ulong *)((pnVar2->m_backend).data._M_elems + 6) =
                   CONCAT35(local_1b8.data._M_elems[7]._1_3_,local_1b8.data._M_elems._24_5_);
              *(undefined8 *)(pnVar2->m_backend).data._M_elems = local_1b8.data._M_elems._0_8_;
              *(undefined8 *)((pnVar2->m_backend).data._M_elems + 2) = local_1b8.data._M_elems._8_8_
              ;
              (pnVar2->m_backend).exp = local_1b8.exp;
              (pnVar2->m_backend).neg = local_1b8.neg;
              (pnVar2->m_backend).fpclass = local_1b8.fpclass;
              (pnVar2->m_backend).prec_elem = local_1b8.prec_elem;
            }
            else {
              local_b0 = pcVar12;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_1b8,0,(type *)0x0);
              pcVar12 = local_b0;
              iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_168,&local_1b8);
              auVar5 = (undefined1  [16])local_128.data._M_elems._0_16_;
              if (iVar7 != 0) goto LAB_002b63f0;
              local_a8.data._M_elems[7]._1_3_ = local_128.data._M_elems[7]._1_3_;
              local_a8.data._M_elems._24_5_ = local_128.data._M_elems._24_5_;
              local_a8.data._M_elems[0] = local_128.data._M_elems[0];
              local_a8.data._M_elems[1] = local_128.data._M_elems[1];
              uVar4 = local_a8.data._M_elems._0_8_;
              local_a8.data._M_elems[2] = local_128.data._M_elems[2];
              local_a8.data._M_elems[3] = local_128.data._M_elems[3];
              local_a8.data._M_elems[8] = local_128.data._M_elems[8];
              local_a8.data._M_elems[9] = local_128.data._M_elems[9];
              local_a8.data._M_elems[4] = local_128.data._M_elems[4];
              local_a8.data._M_elems[5] = local_128.data._M_elems[5];
              local_a8.exp = local_128.exp;
              local_a8.neg = local_128.neg;
              local_a8.fpclass = local_128.fpclass;
              local_a8.prec_elem = local_128.prec_elem;
              local_a8.data._M_elems[0] = auVar5._0_4_;
              if (local_a8.data._M_elems[0] != 0 || local_128.fpclass != cpp_dec_float_finite) {
                local_a8.neg = (bool)(local_128.neg ^ 1);
              }
              local_1b8.fpclass = cpp_dec_float_finite;
              local_1b8.prec_elem = 10;
              local_1b8.data._M_elems[0] = 0;
              local_1b8.data._M_elems[1] = 0;
              local_1b8.data._M_elems[2] = 0;
              local_1b8.data._M_elems[3] = 0;
              local_1b8.data._M_elems[4] = 0;
              local_1b8.data._M_elems[5] = 0;
              local_1b8.data._M_elems._24_5_ = 0;
              local_1b8.data._M_elems[7]._1_3_ = 0;
              local_1b8.data._M_elems._32_5_ = 0;
              local_1b8.data._M_elems[9]._1_3_ = 0;
              local_1b8.exp = 0;
              local_1b8.neg = false;
              pcVar11 = &local_a8;
              if (pcVar12 != &local_1b8) {
                local_1b8.data._M_elems._32_5_ = local_128.data._M_elems._32_5_;
                local_1b8.data._M_elems[9]._1_3_ = local_128.data._M_elems[9]._1_3_;
                local_1b8.data._M_elems[4] = local_128.data._M_elems[4];
                local_1b8.data._M_elems[5] = local_128.data._M_elems[5];
                local_1b8.data._M_elems._24_5_ = local_128.data._M_elems._24_5_;
                local_1b8.data._M_elems[7]._1_3_ = local_128.data._M_elems[7]._1_3_;
                local_1b8.data._M_elems[0] = local_128.data._M_elems[0];
                local_1b8.data._M_elems[1] = local_128.data._M_elems[1];
                local_1b8.data._M_elems[2] = local_128.data._M_elems[2];
                local_1b8.data._M_elems[3] = local_128.data._M_elems[3];
                local_1b8.exp = local_128.exp;
                local_1b8.neg = local_a8.neg;
                local_1b8.fpclass = local_128.fpclass;
                local_1b8.prec_elem = local_128.prec_elem;
                pcVar11 = pcVar12;
              }
              local_128.data._M_elems._0_16_ = auVar5;
              local_a8.data._M_elems._0_8_ = uVar4;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_1b8,pcVar11);
              local_168.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
              local_168.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
              local_168.data._M_elems[4] = local_1b8.data._M_elems[4];
              local_168.data._M_elems[5] = local_1b8.data._M_elems[5];
              local_168.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
              local_168.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
              local_168.data._M_elems[0] = local_1b8.data._M_elems[0];
              local_168.data._M_elems[1] = local_1b8.data._M_elems[1];
              local_168.data._M_elems[2] = local_1b8.data._M_elems[2];
              local_168.data._M_elems[3] = local_1b8.data._M_elems[3];
              local_168.exp = local_1b8.exp;
              local_168.neg = local_1b8.neg;
              local_168.prec_elem = local_1b8.prec_elem;
              local_168.fpclass = local_1b8.fpclass;
              auVar5 = (undefined1  [16])local_1b8.data._M_elems._0_16_;
              local_68.data._M_elems._32_8_ =
                   *(undefined8 *)((local_b8->m_backend).data._M_elems + 8);
              local_68.data._M_elems._0_8_ = *(undefined8 *)(local_b8->m_backend).data._M_elems;
              local_68.data._M_elems._8_8_ =
                   *(undefined8 *)((local_b8->m_backend).data._M_elems + 2);
              local_68.data._M_elems._16_8_ =
                   *(undefined8 *)((local_b8->m_backend).data._M_elems + 4);
              local_68.data._M_elems._24_8_ =
                   *(undefined8 *)((local_b8->m_backend).data._M_elems + 6);
              local_68.exp = (local_b8->m_backend).exp;
              local_68.neg = (local_b8->m_backend).neg;
              local_68.fpclass = (local_b8->m_backend).fpclass;
              local_68.prec_elem = (local_b8->m_backend).prec_elem;
              if ((local_1b8.neg == true) &&
                 (local_1b8.data._M_elems[0] != 0 || local_1b8.fpclass != cpp_dec_float_finite)) {
                local_1b8.neg = false;
              }
              local_1b8.data._M_elems._0_16_ = auVar5;
              if ((local_68.fpclass != cpp_dec_float_NaN && local_1b8.fpclass != cpp_dec_float_NaN)
                 && (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_1b8,&local_68), 0 < iVar7)) {
                *(undefined8 *)((pnVar2->m_backend).data._M_elems + 8) =
                     local_168.data._M_elems._32_8_;
                *(undefined8 *)((pnVar2->m_backend).data._M_elems + 4) =
                     local_168.data._M_elems._16_8_;
                *(ulong *)((pnVar2->m_backend).data._M_elems + 6) =
                     CONCAT35(local_168.data._M_elems[7]._1_3_,local_168.data._M_elems._24_5_);
                *(undefined8 *)(pnVar2->m_backend).data._M_elems = local_168.data._M_elems._0_8_;
                *(undefined8 *)((pnVar2->m_backend).data._M_elems + 2) =
                     local_168.data._M_elems._8_8_;
                (pnVar2->m_backend).exp = local_168.exp;
                (pnVar2->m_backend).neg = local_168.neg;
                (pnVar2->m_backend).fpclass = local_168.fpclass;
                (pnVar2->m_backend).prec_elem = local_168.prec_elem;
                lVar9 = (long)local_174;
                local_174 = local_174 + 1;
                local_e0[lVar9] = iVar8;
              }
            }
            piVar13 = piVar13 + 1;
            pcVar12 = pcVar12 + 1;
            iVar6 = iVar6 + -1;
          } while ((int)local_170 < iVar6);
        }
      }
      else {
        local_1b8.fpclass = cpp_dec_float_finite;
        local_1b8.prec_elem = 10;
        local_1b8.data._M_elems[0] = 0;
        local_1b8.data._M_elems[1] = 0;
        local_1b8.data._M_elems[2] = 0;
        local_1b8.data._M_elems[3] = 0;
        local_1b8.data._M_elems[4] = 0;
        local_1b8.data._M_elems[5] = 0;
        local_1b8.data._M_elems._24_5_ = 0;
        local_1b8.data._M_elems[7]._1_3_ = 0;
        local_1b8.data._M_elems._32_5_ = 0;
        local_1b8.data._M_elems[9]._1_3_ = 0;
        local_1b8.exp = 0;
        local_1b8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_1b8,0.0);
        iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_128,&local_1b8);
        if (iVar6 != 0) goto LAB_002b631c;
      }
      lVar9 = local_c0;
    } while (local_c8 < local_c0);
  }
  return local_174;
}

Assistant:

int CLUFactor<R>::solveLleftForest(R eps, R* vec, int* nonz, int n)
{
   int i, j, k, end;
   R x, y;
   R* val, *lval;
   int* idx, *lidx, *lrow, *lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      assert(i >= 0 && i < l.size);

      if((x = vec[lrow[i]]) != 0.0)
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         val = &lval[k];
         idx = &lidx[k];

         for(j = lbeg[i + 1]; j > k; --j)
         {
            int m = *idx++;
            assert(m >= 0 && m < thedim);
            y = vec[m];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  vec[m] = y;
                  nonz[n++] = m;
               }
            }
            else
            {
               y -= x * (*val++);
               vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }

   return n;
}